

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

DataDeclarationSyntax * __thiscall
slang::parsing::Parser::parseDataDeclaration(Parser *this,AttrList attributes)

{
  char *pcVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined2 prev_00;
  Token semi_00;
  TokenKind mod;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  Diagnostic *pDVar7;
  SyntaxNode *this_00;
  SourceLocation location;
  DataDeclarationSyntax *pDVar8;
  byte bVar9;
  value_type *elements;
  ulong pos0;
  uint uVar10;
  bitmask<slang::parsing::detail::TypeOptions> options;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_00;
  ulong hash;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  char cVar15;
  char cVar17;
  char cVar18;
  byte bVar19;
  undefined1 auVar16 [16];
  undefined1 auVar20 [16];
  Token TVar21;
  SourceRange SVar22;
  string_view sVar23;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> sVar24;
  Token lastLifetime;
  Token t;
  Token prev;
  Token semi;
  SmallVector<slang::parsing::Token,_4UL> modifiers;
  SmallMap<slang::parsing::TokenKind,_slang::parsing::Token,_4UL,_std::pair<const_slang::parsing::TokenKind,_slang::parsing::Token>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::parsing::TokenKind,_slang::parsing::Token>,_96UL,_16UL>_>
  modifierSet;
  undefined1 local_68 [32];
  EVP_PKEY_CTX *local_48;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> local_40;
  
  modifiers.super_SmallVectorBase<slang::parsing::Token>.data_ =
       (pointer)modifiers.super_SmallVectorBase<slang::parsing::Token>.firstElement;
  modifiers.super_SmallVectorBase<slang::parsing::Token>.len = 0;
  modifiers.super_SmallVectorBase<slang::parsing::Token>.cap = 4;
  SmallMap<slang::parsing::TokenKind,_slang::parsing::Token,_4UL,_std::pair<const_slang::parsing::TokenKind,_slang::parsing::Token>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::parsing::TokenKind,_slang::parsing::Token>,_96UL,_16UL>_>
  ::SmallMap(&modifierSet);
  Token::Token(&lastLifetime);
  bVar5 = false;
  bVar6 = false;
  bVar9 = 0;
  bVar14 = false;
LAB_0029d007:
  do {
    TVar21 = ParserBase::peek(&this->super_ParserBase);
    bVar4 = slang::syntax::SyntaxFacts::isDeclarationModifier(TVar21.kind);
    if (!bVar4) {
      options.m_bits._1_3_ = 0;
      options.m_bits._0_1_ = bVar9;
      this_00 = (SyntaxNode *)parseDataType(this,options);
      if (this_00->kind == TypeReference && bVar9 == 0) {
        prev = slang::syntax::SyntaxNode::getFirstToken(this_00);
        location = Token::location(&prev);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xaa0005,location);
      }
      Token::Token(&semi);
      sVar24 = parseDeclarators(this,&semi,false,false);
      prev.info._0_4_ = 1;
      prev._0_8_ = &PTR_getChild_006a3268;
      SmallVectorBase<slang::parsing::Token>::copy
                (&modifiers.super_SmallVectorBase<slang::parsing::Token>,
                 (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,
                 (EVP_PKEY_CTX *)sVar24._M_extent._M_extent_value._M_extent_value);
      t.info._0_4_ = 2;
      t._0_8_ = &PTR_getChild_006a3868;
      local_68._8_4_ = SeparatedList;
      local_68._16_16_ = (undefined1  [16])0x0;
      local_68._0_8_ = &PTR_getChild_006a3ca0;
      attributes_00 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&prev;
      semi_00.info = semi.info;
      semi_00.kind = semi.kind;
      semi_00._2_1_ = semi._2_1_;
      semi_00.numFlags.raw = semi.numFlags.raw;
      semi_00.rawLen = semi.rawLen;
      local_48 = (EVP_PKEY_CTX *)sVar24._M_extent._M_extent_value._M_extent_value;
      local_40 = sVar24;
      pDVar8 = slang::syntax::SyntaxFactory::dataDeclaration
                         (&this->factory,attributes_00,(TokenList *)&t,(DataTypeSyntax *)this_00,
                          (SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)local_68,semi_00);
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_slang::parsing::Token>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::parsing::TokenKind,_void>,_std::equal_to<slang::parsing::TokenKind>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::parsing::TokenKind,_slang::parsing::Token>,_96UL,_16UL>_>
      ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_slang::parsing::Token>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::parsing::TokenKind,_void>,_std::equal_to<slang::parsing::TokenKind>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::parsing::TokenKind,_slang::parsing::Token>,_96UL,_16UL>_>
                     *)&modifierSet.super_Storage.field_0x68);
      SmallVectorBase<slang::parsing::Token>::cleanup
                (&modifiers.super_SmallVectorBase<slang::parsing::Token>,
                 (EVP_PKEY_CTX *)attributes_00);
      return pDVar8;
    }
    t = ParserBase::consume(&this->super_ParserBase);
    SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
              (&modifiers.super_SmallVectorBase<slang::parsing::Token>,&t);
    auVar16[0] = -((char)t.kind == 'C');
    auVar16[1] = -(t.kind._1_1_ == '\x01');
    auVar16[2] = 0xff;
    auVar16[3] = 0xff;
    auVar16[4] = 0xff;
    auVar16[5] = 0xff;
    auVar16[6] = 0xff;
    auVar16[7] = 0xff;
    auVar16[8] = 0xff;
    auVar16[9] = 0xff;
    auVar16[10] = 0xff;
    auVar16[0xb] = 0xff;
    auVar16[0xc] = 0xff;
    auVar16[0xd] = 0xff;
    auVar16[0xe] = 0xff;
    auVar16[0xf] = 0xff;
    if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe | 0x8000) == 0xffff) {
      bVar9 = 1;
    }
    hash = SUB168(ZEXT216(t.kind) * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(ZEXT216(t.kind) * ZEXT816(0x9e3779b97f4a7c15),0);
    pos0 = hash >> (modifierSet._112_1_ & 0x3f);
    uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[hash & 0xff];
    uVar13 = 0;
    uVar12 = pos0;
    do {
      pcVar1 = (char *)(modifierSet._128_8_ + uVar12 * 0x10);
      cVar15 = (char)uVar2;
      auVar20[0] = -(*pcVar1 == cVar15);
      cVar17 = (char)((uint)uVar2 >> 8);
      auVar20[1] = -(pcVar1[1] == cVar17);
      cVar18 = (char)((uint)uVar2 >> 0x10);
      auVar20[2] = -(pcVar1[2] == cVar18);
      bVar19 = (byte)((uint)uVar2 >> 0x18);
      auVar20[3] = -(pcVar1[3] == bVar19);
      auVar20[4] = -(pcVar1[4] == cVar15);
      auVar20[5] = -(pcVar1[5] == cVar17);
      auVar20[6] = -(pcVar1[6] == cVar18);
      auVar20[7] = -(pcVar1[7] == bVar19);
      auVar20[8] = -(pcVar1[8] == cVar15);
      auVar20[9] = -(pcVar1[9] == cVar17);
      auVar20[10] = -(pcVar1[10] == cVar18);
      auVar20[0xb] = -(pcVar1[0xb] == bVar19);
      auVar20[0xc] = -(pcVar1[0xc] == cVar15);
      auVar20[0xd] = -(pcVar1[0xd] == cVar17);
      auVar20[0xe] = -(pcVar1[0xe] == cVar18);
      auVar20[0xf] = -(pcVar1[0xf] == bVar19);
      uVar10 = (uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe);
      if (uVar10 != 0) {
        lVar11 = modifierSet._136_8_ + uVar12 * 0x168;
        do {
          uVar3 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          if (t.kind == *(TokenKind *)(lVar11 + (ulong)uVar3 * 0x18)) {
            bVar4 = !bVar14;
            bVar14 = true;
            if (bVar4) {
              SVar22 = Token::range(&t);
              pDVar7 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x260005,SVar22);
              sVar23 = Token::rawText(&t);
              pDVar7 = Diagnostic::operator<<(pDVar7,sVar23);
              SVar22 = Token::range((Token *)(lVar11 + (ulong)uVar3 * 0x18 + 8));
              Diagnostic::operator<<(pDVar7,SVar22);
            }
            goto LAB_0029d007;
          }
          uVar10 = uVar10 - 1 & uVar10;
        } while (uVar10 != 0);
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & pcVar1[0xf]) == 0) break;
      lVar11 = uVar12 + uVar13;
      uVar13 = uVar13 + 1;
      uVar12 = lVar11 + 1U & modifierSet._120_8_;
    } while (uVar13 <= (ulong)modifierSet._120_8_);
    if ((ulong)modifierSet._152_8_ < (ulong)modifierSet._144_8_) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,slang::parsing::Token>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,slang::detail::hashing::StackAllocator<std::pair<slang::parsing::TokenKind_const,slang::parsing::Token>,96ul,16ul>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind&,slang::parsing::Token&>
                ((locator *)&prev,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,slang::parsing::Token>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,slang::detail::hashing::StackAllocator<std::pair<slang::parsing::TokenKind_const,slang::parsing::Token>,96ul,16ul>>
                  *)&modifierSet.super_Storage.field_0x68,pos0,hash,(try_emplace_args_t *)local_68,
                 &t.kind,&t);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,slang::parsing::Token>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,slang::detail::hashing::StackAllocator<std::pair<slang::parsing::TokenKind_const,slang::parsing::Token>,96ul,16ul>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind&,slang::parsing::Token&>
                ((locator *)&prev,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,slang::parsing::Token>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,slang::detail::hashing::StackAllocator<std::pair<slang::parsing::TokenKind_const,slang::parsing::Token>,96ul,16ul>>
                  *)&modifierSet.super_Storage.field_0x68,hash,(try_emplace_args_t *)local_68,
                 &t.kind,&t);
    }
    bVar4 = slang::syntax::SyntaxFacts::isLifetimeModifier(t.kind);
    TVar21 = t;
    if (bVar4) {
      if (lastLifetime.info != (Info *)0x0) {
        if (bVar6) {
          bVar6 = true;
          t = TVar21;
        }
        else {
          SVar22 = Token::range(&t);
          pDVar7 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x170005,SVar22);
          sVar23 = Token::rawText(&t);
          Diagnostic::operator<<(pDVar7,sVar23);
          sVar23 = Token::rawText(&lastLifetime);
          pDVar7 = Diagnostic::operator<<(pDVar7,sVar23);
          SVar22 = Token::range(&lastLifetime);
          Diagnostic::operator<<(pDVar7,SVar22);
          bVar6 = true;
        }
        goto LAB_0029d007;
      }
      lastLifetime.kind = t.kind;
      lastLifetime._2_1_ = t._2_1_;
      lastLifetime.numFlags.raw = t.numFlags.raw;
      lastLifetime.rawLen = t.rawLen;
      lastLifetime.info = t.info;
    }
    if (bVar5) {
      bVar5 = true;
      t = TVar21;
    }
    else if (modifiers.super_SmallVectorBase<slang::parsing::Token>.len < 2) {
      bVar5 = false;
      t = TVar21;
    }
    else {
      prev_00 = modifiers.super_SmallVectorBase<slang::parsing::Token>.data_
                [modifiers.super_SmallVectorBase<slang::parsing::Token>.len - 2].kind;
      prev = modifiers.super_SmallVectorBase<slang::parsing::Token>.data_
             [modifiers.super_SmallVectorBase<slang::parsing::Token>.len - 2];
      t.kind = TVar21.kind;
      mod = t.kind;
      t = TVar21;
      bVar5 = slang::syntax::SyntaxFacts::isModifierAllowedAfter(mod,prev_00);
      if (!bVar5) {
        SVar22 = Token::range(&t);
        pDVar7 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x180005,SVar22);
        sVar23 = Token::rawText(&t);
        Diagnostic::operator<<(pDVar7,sVar23);
        sVar23 = Token::rawText(&prev);
        pDVar7 = Diagnostic::operator<<(pDVar7,sVar23);
        SVar22 = Token::range(&prev);
        Diagnostic::operator<<(pDVar7,SVar22);
      }
      bVar5 = !bVar5;
    }
  } while( true );
}

Assistant:

DataDeclarationSyntax& Parser::parseDataDeclaration(AttrList attributes) {
    SmallVector<Token, 4> modifiers;
    SmallMap<TokenKind, Token, 4> modifierSet;
    Token lastLifetime;
    bool hasVar = false;
    bool errorDup = false;
    bool errorLifetime = false;
    bool errorOrdering = false;

    while (isDeclarationModifier(peek().kind)) {
        Token t = consume();
        modifiers.push_back(t);
        if (t.kind == TokenKind::VarKeyword)
            hasVar = true;

        if (auto [it, inserted] = modifierSet.emplace(t.kind, t); !inserted) {
            if (!errorDup) {
                auto& diag = addDiag(diag::DuplicateDeclModifier, t.range());
                diag << t.rawText() << it->second.range();
                errorDup = true;
            }
            continue;
        }

        if (SyntaxFacts::isLifetimeModifier(t.kind)) {
            if (lastLifetime) {
                if (!errorLifetime) {
                    auto& diag = addDiag(diag::DeclModifierConflict, t.range());
                    diag << t.rawText();
                    diag << lastLifetime.rawText() << lastLifetime.range();
                    errorLifetime = true;
                }
                continue;
            }
            lastLifetime = t;
        }

        if (!errorOrdering && modifiers.size() > 1) {
            Token prev = modifiers[modifiers.size() - 2];
            if (!SyntaxFacts::isModifierAllowedAfter(t.kind, prev.kind)) {
                auto& diag = addDiag(diag::DeclModifierOrdering, t.range());
                diag << t.rawText();
                diag << prev.rawText() << prev.range();
                errorOrdering = true;
            }
        }
    }

    auto& dataType = parseDataType(hasVar ? TypeOptions::AllowImplicit : TypeOptions::None);
    if (dataType.kind == SyntaxKind::TypeReference && !hasVar)
        addDiag(diag::TypeRefDeclVar, dataType.getFirstToken().location());

    Token semi;
    auto declarators = parseDeclarators(semi);

    return factory.dataDeclaration(attributes, modifiers.copy(alloc), dataType, declarators, semi);
}